

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

bool __thiscall
ContextSpecificHolder<Extensions,_(unsigned_char)'\xa3',_(OptionType)1>::Decode
          (ContextSpecificHolder<Extensions,_(unsigned_char)__xa3_,_(OptionType)1> *this,uchar *pIn,
          size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  out_of_range *this_00;
  size_t local_38;
  size_t size;
  
  if (cbIn == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Insufficient buffer");
LAB_00124002:
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (*pIn == 0xa3) {
    local_38 = 0;
    size = 0;
    if (cbIn < 3) {
      if ((cbIn != 2) || (pIn[1] != '\0')) goto LAB_00123f9e;
      local_38 = 2;
      size = 2;
    }
    else {
      bVar1 = DecodeSize(pIn + 1,cbIn - 1,&local_38,&size);
      if ((!bVar1) || (cbIn < size + local_38 + 1)) {
        this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this_00,"Illegal size value");
        goto LAB_00124002;
      }
      size = size + 1;
    }
    bVar1 = Extensions::Decode(&this->innerType,pIn + size,local_38,cbUsed);
    if (bVar1) {
      *cbUsed = *cbUsed + size;
      this->hasData = true;
      return true;
    }
  }
LAB_00123f9e:
  *cbUsed = 0;
  return false;
}

Assistant:

bool Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
	{
        // If this is an optional type, we could have used
        // all the bytes on the previous item
        if (cbIn == 0)
            throw std::out_of_range("Insufficient buffer");

        if (pIn[0] == type)
        {
            size_t offset = 0;

            // Validate the sequence
            size_t size = 0;
            size_t cbPrefix = 0;

            if (!CheckDecode(pIn, cbIn, static_cast<const DerType>(*pIn), size, cbPrefix))
            {
                cbUsed = 0;
                return false;
            }

            offset += cbPrefix;
            // Now, we can decode the inner type
            if (innerType.Decode(pIn + offset, size, cbUsed))
            {
                cbUsed += cbPrefix;
                hasData = true;
                return true;
            }
        }

        cbUsed = 0;
        return false;
	}